

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O0

void __thiscall
MPL::detail::ModelPackageImpl::createItemInfoEntry
          (ModelPackageImpl *this,string *identifier,string *path,string *name,string *author,
          string *description)

{
  char *pcVar1;
  bool bVar2;
  pointer pJVar3;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> local_138;
  allocator<char> local_129;
  string local_128;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> local_108;
  undefined1 local_100 [8];
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntries;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> local_48;
  undefined1 local_40 [8];
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntry;
  string *description_local;
  string *author_local;
  string *name_local;
  string *path_local;
  string *identifier_local;
  ModelPackageImpl *this_local;
  
  itemInfoEntry._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
  super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
  super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl =
       (__uniq_ptr_data<JsonMap,_std::default_delete<JsonMap>,_true,_true>)
       (__uniq_ptr_data<JsonMap,_std::default_delete<JsonMap>,_true,_true>)description;
  getItemInfoEntry((ModelPackageImpl *)local_40,(string *)this);
  bVar2 = std::operator==((nullptr_t)0x0,
                          (unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_40);
  if (bVar2) {
    std::make_unique<JsonMap>();
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator=
              ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_40,&local_48);
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr(&local_48);
  }
  pJVar3 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                     ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_40);
  pcVar1 = kModelPackageItemInfoPathKey;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar1,&local_79);
  JsonMap::setString(pJVar3,&local_78,path);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  pJVar3 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                     ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_40);
  pcVar1 = kModelPackageItemInfoNameKey;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar1,&local_a1);
  JsonMap::setString(pJVar3,&local_a0,name);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pJVar3 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                     ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_40);
  pcVar1 = kModelPackageItemInfoAuthorKey;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar1,&local_c9);
  JsonMap::setString(pJVar3,&local_c8,author);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pJVar3 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                     ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_40);
  pcVar1 = kModelPackageItemInfoDescriptionKey;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,pcVar1,
             (allocator<char> *)
             ((long)&itemInfoEntries._M_t.
                     super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                     super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                     super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl + 7));
  JsonMap::setString(pJVar3,&local_f0,
                     (string *)
                     itemInfoEntry._M_t.
                     super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                     super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                     super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&itemInfoEntries._M_t.
                     super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                     super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                     super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl + 7));
  getItemInfoEntries((ModelPackageImpl *)local_100);
  pJVar3 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->
                     ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_100);
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::unique_ptr
            (&local_108,(unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_40);
  JsonMap::setObject(pJVar3,identifier,&local_108);
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr(&local_108);
  pJVar3 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->(&this->m_manifest);
  pcVar1 = kModelPackageItemInfoEntriesKey;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,pcVar1,&local_129);
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::unique_ptr
            (&local_138,(unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_100);
  JsonMap::setObject(pJVar3,&local_128,&local_138);
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr(&local_138);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_100);
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_40);
  return;
}

Assistant:

void ModelPackageImpl::createItemInfoEntry(const std::string& identifier, const std::string& path, const std::string& name, const std::string& author, const std::string& description) {
    auto itemInfoEntry = getItemInfoEntry(identifier);
    
    if (nullptr == itemInfoEntry) {
        itemInfoEntry = std::make_unique<JsonMap>();
    }
    
    itemInfoEntry->setString(kModelPackageItemInfoPathKey, path);
    itemInfoEntry->setString(kModelPackageItemInfoNameKey, name);
    itemInfoEntry->setString(kModelPackageItemInfoAuthorKey, author);
    itemInfoEntry->setString(kModelPackageItemInfoDescriptionKey, description);
    
    auto itemInfoEntries = getItemInfoEntries();
    itemInfoEntries->setObject(identifier, std::move(itemInfoEntry));
    m_manifest->setObject(kModelPackageItemInfoEntriesKey, std::move(itemInfoEntries));
}